

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage_module.h
# Opt level: O3

void __thiscall shift_window_transformer::StageModule<float>::~StageModule(StageModule<float> *this)

{
  SwinBlock<float> *this_00;
  pointer ppSVar1;
  ulong uVar2;
  
  (this->super_Layer<float>)._vptr_Layer = (_func_int **)&PTR_forward_0010ba28;
  ppSVar1 = (this->layers).
            super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->layers).
      super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppSVar1) {
    uVar2 = 0;
    do {
      this_00 = ppSVar1[uVar2];
      if (this_00 != (SwinBlock<float> *)0x0) {
        SwinBlock<float>::~SwinBlock(this_00,&SwinBlock<float>::VTT);
      }
      operator_delete(this_00,0x38);
      uVar2 = uVar2 + 1;
      ppSVar1 = (this->layers).
                super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(this->layers).
                                   super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1 >> 3))
    ;
  }
  if (ppSVar1 != (pointer)0x0) {
    operator_delete(ppSVar1,(long)(this->layers).
                                  super__Vector_base<shift_window_transformer::SwinBlock<float>_*,_std::allocator<shift_window_transformer::SwinBlock<float>_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar1
                   );
  }
  (this->patch_partition).super_Layer<float>._vptr_Layer = (_func_int **)&PTR_forward_0010bbb0;
  Linear<float>::~Linear(&(this->patch_partition).layer);
  return;
}

Assistant:

~StageModule() {
            for (int i = 0; i < layers.size(); ++i) {
                delete layers[i];
            }
        }